

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void remove_copy(gen_ctx_t gen_ctx,MIR_insn_t insn)

{
  ssa_edge_t_conflict ssa_edge;
  bb_insn_t_conflict new_bb_insn;
  long lVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  uint new_def_op_num;
  
  iVar3 = move_p(insn);
  if ((iVar3 == 0) && (*(long *)&insn->field_0x18 != 0x2000000ba)) {
    __assert_fail("move_p (insn) || (insn->code == MIR_PHI && insn->nops == 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x108c,"void remove_copy(gen_ctx_t, MIR_insn_t)");
  }
  ssa_edge = (ssa_edge_t_conflict)insn[1].data;
  new_bb_insn = ssa_edge->def;
  new_def_op_num = (uint)ssa_edge->def_op_num;
  remove_ssa_edge(ssa_edge);
  lVar1 = *(long *)((long)&new_bb_insn->insn->ops[0].data + (ulong)(new_def_op_num * 0x30));
  if (lVar1 == 0) {
    lVar4 = 0;
  }
  else {
    do {
      lVar4 = lVar1;
      lVar1 = *(long *)(lVar4 + 0x20);
    } while (*(long *)(lVar4 + 0x20) != 0);
  }
  change_ssa_edge_list_def
            ((ssa_edge_t_conflict)insn->ops[0].data,new_bb_insn,new_def_op_num,insn->ops[0].u.reg,
             *(MIR_reg_t *)&insn[1].insn_link.next);
  pvVar2 = insn->ops[0].data;
  if (lVar4 == 0) {
    *(void **)((long)&new_bb_insn->insn->ops[0].data + (ulong)(new_def_op_num * 0x30)) = pvVar2;
  }
  else {
    *(void **)(lVar4 + 0x20) = pvVar2;
  }
  pvVar2 = insn->ops[0].data;
  if (pvVar2 != (void *)0x0) {
    *(long *)((long)pvVar2 + 0x18) = lVar4;
  }
  insn->ops[0].data = (void *)0x0;
  if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    fprintf((FILE *)gen_ctx->debug_file,"    Remove copy %-5lu",
            (ulong)*(uint *)((long)insn->data + 0xc));
    print_bb_insn(gen_ctx,(bb_insn_t_conflict)insn->data,0);
  }
  gen_delete_insn(gen_ctx,insn);
  return;
}

Assistant:

static void remove_copy (gen_ctx_t gen_ctx, MIR_insn_t insn) {
  ssa_edge_t se, last_se;
  bb_insn_t def;
  int def_op_num;

  gen_assert (move_p (insn) || (insn->code == MIR_PHI && insn->nops == 2));
  se = insn->ops[1].data;
  def = se->def;
  def_op_num = se->def_op_num;
  remove_ssa_edge (se);
  if ((last_se = def->insn->ops[def_op_num].data) != NULL)
    while (last_se->next_use != NULL) last_se = last_se->next_use;
  change_ssa_edge_list_def (insn->ops[0].data, def, def_op_num, insn->ops[0].u.var,
                            insn->ops[1].u.var);
  if (last_se != NULL)
    last_se->next_use = insn->ops[0].data;
  else
    def->insn->ops[def_op_num].data = insn->ops[0].data;
  if (insn->ops[0].data != NULL) ((ssa_edge_t) insn->ops[0].data)->prev_use = last_se;
  insn->ops[0].data = NULL;
  DEBUG (2, {
    fprintf (debug_file, "    Remove copy %-5lu", (unsigned long) ((bb_insn_t) insn->data)->index);
    print_bb_insn (gen_ctx, insn->data, FALSE);
  });
  gen_delete_insn (gen_ctx, insn);
}